

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iffl_allocator.h
# Opt level: O2

void __thiscall
iffl::debug_memory_resource::do_deallocate
          (debug_memory_resource *this,void *p,size_t bytes,size_t alignment)

{
  ulong uVar1;
  
  decrement_busy_block_count(this);
  if ((*(long *)((long)p + -8) == 0xbeefabcd) &&
     (*(debug_memory_resource **)((long)p + -0x10) == this)) {
    uVar1 = *(ulong *)((long)p + -0x20);
    if ((0x28 < uVar1) &&
       (((uVar1 - 0x28 == bytes && (*(size_t *)((long)p + -0x18) == alignment)) &&
        (*(long *)((long)p + (uVar1 - 0x28)) == 0xdeadabcd)))) {
      *(undefined8 *)((long)p + -0x10) = 0;
      *(undefined8 *)((long)p + -8) = 0xbeefabce;
      *(undefined8 *)((long)p + (uVar1 - 0x28)) = 0xdeadabce;
      free((ulong *)((long)p + -0x20));
      return;
    }
  }
  std::terminate();
}

Assistant:

void do_deallocate(void* p, size_t bytes, [[maybe_unused]] size_t alignment) noexcept override {

        decrement_busy_block_count();

        prefix_t *prefix{ static_cast<prefix_t *>(p) - 1 };
        FFL_CODDING_ERROR_IF_NOT(prefix->pattern == busy_block_prefix_pattern);
        FFL_CODDING_ERROR_IF_NOT(prefix->memory_resource == this);
        FFL_CODDING_ERROR_IF_NOT(prefix->size > min_allocation_size);
        size_t const user_allocation_size = prefix->size - min_allocation_size;
        FFL_CODDING_ERROR_IF_NOT(user_allocation_size == bytes);
        FFL_CODDING_ERROR_IF_NOT(prefix->alignment == alignment);
        suffix_t *suffix{ reinterpret_cast<suffix_t *>(reinterpret_cast<char *>(prefix) + prefix->size) - 1 };
        FFL_CODDING_ERROR_IF_NOT(suffix->pattern == busy_block_suffix_pattern);

        prefix->memory_resource = nullptr;
        prefix->pattern = free_block_prefix_pattern;
        suffix->pattern = free_block_suffix_pattern;

        FFL_ALLIGNED_FREE(prefix);
    }